

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetExpressScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,BOOL *pbNewScan)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double local_c8;
  double local_c0;
  double theta2;
  double theta1;
  double dtheta2;
  double dtheta1;
  char dtheta2_q3;
  char dtheta1_q3;
  unsigned_short distance2;
  unsigned_short distance1;
  unsigned_short start_angle_q6_prev;
  unsigned_short start_angle_q6;
  uchar databuf [84];
  int j;
  BOOL *pbNewScan_local;
  double *pAngles_local;
  double *pDistances_local;
  RPLIDAR *pRPLIDAR_local;
  
  databuf[0x4c] = '\0';
  databuf[0x4d] = '\0';
  databuf[0x4e] = '\0';
  databuf[0x4f] = '\0';
  unique0x10000370 = pbNewScan;
  memset(&distance2,0,0x54);
  iVar11 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,(uchar *)&distance2,0x54);
  if (iVar11 == 0) {
    uVar9 = (distance1._1_1_ & 0x7f) << 8 | (ushort)(byte)distance1;
    uVar10 = (pRPLIDAR->esdata_prev[3] & 0x7f) << 8 | (ushort)pRPLIDAR->esdata_prev[2];
    *stack0xffffffffffffffd0 = (int)(uint)pRPLIDAR->esdata_prev[3] >> 7;
    databuf[0x4c] = '\0';
    databuf[0x4d] = '\0';
    databuf[0x4e] = '\0';
    databuf[0x4f] = '\0';
    for (; (int)databuf._76_4_ < 0x10; databuf._76_4_ = databuf._76_4_ + 1) {
      uVar1 = pRPLIDAR->esdata_prev[databuf._76_4_ * 5 + 5];
      uVar2 = pRPLIDAR->esdata_prev[databuf._76_4_ * 5 + 4];
      uVar3 = pRPLIDAR->esdata_prev[databuf._76_4_ * 5 + 7];
      uVar4 = pRPLIDAR->esdata_prev[databuf._76_4_ * 5 + 2];
      bVar5 = (pRPLIDAR->esdata_prev[databuf._76_4_ * 5 + 4] & 3) << 4;
      bVar6 = bVar5 | pRPLIDAR->esdata_prev[databuf._76_4_ * 5 + 8] & 0xf;
      bVar7 = (pRPLIDAR->esdata_prev[databuf._76_4_ * 5 + 6] & 3) << 4;
      bVar8 = bVar7 | (byte)((int)(uint)pRPLIDAR->esdata_prev[databuf._76_4_ * 5 + 8] >> 4);
      if ((char)(bVar5 & 0x20) >> 5 == '\0') {
        uVar12 = (int)(char)bVar6 & 0x1f;
      }
      else {
        uVar12 = -((int)(char)bVar6 & 0x1fU ^ 0xffffffff);
      }
      local_c0 = (double)(int)uVar12 / 8.0;
      if ((char)(bVar7 & 0x20) >> 5 == '\0') {
        uVar12 = (int)(char)bVar8 & 0x1f;
      }
      else {
        uVar12 = -((int)(char)bVar8 & 0x1fU ^ 0xffffffff);
      }
      local_c8 = (double)(int)uVar12 / 8.0;
      dVar14 = AngleDiffRPLIDAR((double)uVar10 / 64.0,(double)uVar9 / 64.0);
      iVar11 = databuf._76_4_ * 2;
      dVar15 = AngleDiffRPLIDAR((double)uVar10 / 64.0,(double)uVar9 / 64.0);
      iVar13 = databuf._76_4_ * 2;
      dVar14 = fmod_2PI_deg2rad(-(((double)uVar10 / 64.0 + (dVar14 * (double)(iVar11 + 1)) / 32.0) -
                                 local_c0));
      pAngles[(int)(databuf._76_4_ << 1)] = dVar14;
      dVar14 = fmod_2PI_deg2rad(-(((double)uVar10 / 64.0 + (dVar15 * (double)(iVar13 + 2)) / 32.0) -
                                 local_c8));
      pAngles[databuf._76_4_ * 2 + 1] = dVar14;
      pDistances[(int)(databuf._76_4_ << 1)] =
           (double)((int)(uint)CONCAT11(uVar1,uVar2) >> 2) / 1000.0;
      pDistances[databuf._76_4_ * 2 + 1] = (double)((int)(uint)CONCAT11(uVar3,uVar4) >> 2) / 1000.0;
    }
    memcpy(pRPLIDAR->esdata_prev,&distance2,0x54);
    pRPLIDAR_local._4_4_ = 0;
  }
  else {
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int GetExpressScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, BOOL* pbNewScan)
{
	int j = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT	
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	int nbMeasurements = NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;
	CHRONO chrono;

	StartChrono(&chrono);

	if (!pRPLIDAR->nodes_cache->empty())
	{
		for (j = 0; j < min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size()); j++)
		{
			nodes[j] = pRPLIDAR->nodes_cache->front();
			pRPLIDAR->nodes_cache->pop_front();
		}
		nodesRead = min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size());
	}
	while ((int)nodesRead < nbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = nbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}
	if ((int)nodesRead > nbMeasurements)
	{
		for (j = nbMeasurements; j < (int)nodesRead; j++)
		{
			pRPLIDAR->nodes_cache->push_back(nodes[j]);
		}
	}

	// Analyze the data response.
	*pbNewScan = 0;

	//memset(pAngles, 0, nbMeasurements*sizeof(double));
	//memset(pDistances, 0, nbMeasurements*sizeof(double));
	for (j = 0; j < nbMeasurements; j++)
	{
		*pbNewScan = (*pbNewScan) | (nodes[j].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);

		// Convert in rad.
		pAngles[j] = fmod_2PI_deg2rad(-nodes[j].angle_z_q14*90.0/(1 << 14));

		// Convert in m.
		pDistances[j] = nodes[j].dist_mm_q2/4000.0;
	}
#else
	unsigned char databuf[NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	unsigned short start_angle_q6 = 0;
	unsigned short start_angle_q6_prev = 0;
	unsigned short distance1 = 0;
	unsigned short distance2 = 0;
	char dtheta1_q3 = 0;
	char dtheta2_q3 = 0;
	double dtheta1 = 0;
	double dtheta2 = 0;
	double theta1 = 0;
	double theta2 = 0;

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	start_angle_q6 = ((databuf[3] & 0x7F)<<8) | databuf[2];

	// Analyze the previous data response.
	start_angle_q6_prev = ((pRPLIDAR->esdata_prev[3] & 0x7F)<<8) | pRPLIDAR->esdata_prev[2];
	*pbNewScan = pRPLIDAR->esdata_prev[3]>>7;

	//memset(pAngles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
	//memset(pDistances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
	for (j = 0; j < NB_CABINS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
	{
		distance1 = ((pRPLIDAR->esdata_prev[4+5*j+1]<<8)|pRPLIDAR->esdata_prev[4+5*j+0])>>2;
		distance2 = ((pRPLIDAR->esdata_prev[4+5*j+3]<<8)|pRPLIDAR->esdata_prev[5*j+2])>>2;
		dtheta1_q3 = ((pRPLIDAR->esdata_prev[4+5*j+0] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4] & 0x0F);
		dtheta2_q3 = ((pRPLIDAR->esdata_prev[4+5*j+2] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4]>>4);
		// Handle the sign bit...
		dtheta1 = ((dtheta1_q3 & 0x20)>>5)? (-~(dtheta1_q3 & 0x1F))/8.0: (dtheta1_q3 & 0x1F)/8.0;
		dtheta2 = ((dtheta2_q3 & 0x20)>>5)? (-~(dtheta2_q3 & 0x1F))/8.0: (dtheta2_q3 & 0x1F)/8.0;

		// k indexes in the formula of the documentation start at 1...
		theta1 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+1)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta1;
		theta2 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+2)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta2;

		// Convert in rad.
		pAngles[2*j+0] = fmod_2PI_deg2rad(-theta1);
		pAngles[2*j+1] = fmod_2PI_deg2rad(-theta2);

		// Convert in m.
		pDistances[2*j+0] = distance1/1000.0;
		pDistances[2*j+1] = distance2/1000.0;
	}

	memcpy(pRPLIDAR->esdata_prev, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}